

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

void SaveErrors(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *errors,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *error_out)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *error;
  pointer __args;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  char *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  
  args = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          (in_FS_OFFSET + 0x28);
  pbVar1 = (errors->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__args = (errors->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; __args != pbVar1; __args = __args + 1) {
    if (error_out ==
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/args.cpp"
      ;
      source_file._M_len = 0x58;
      logging_function._M_str = "SaveErrors";
      logging_function._M_len = 10;
      LogPrintf_<std::__cxx11::string>
                (logging_function,source_file,0x18d,
                 IPC|I2P|VALIDATION|COINDB|LIBEVENT|PRUNE|ADDRMAN|WALLETDB|ZMQ|HTTP|TOR|NET,
                 (Level)__args,in_stack_ffffffffffffffc0,args);
    }
    else {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)error_out,
                 __args);
    }
  }
  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_FS_OFFSET + 0x28)
      == args) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SaveErrors(const std::vector<std::string> errors, std::vector<std::string>* error_out)
{
    for (const auto& error : errors) {
        if (error_out) {
            error_out->emplace_back(error);
        } else {
            LogPrintf("%s\n", error);
        }
    }
}